

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UserPass.cpp
# Opt level: O3

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
Vault::UserPass::updatePassword
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,UserPass *this,Path *path,Parameters *parameters)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Client *client;
  long *plVar2;
  ulong *puVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  Path local_90;
  Url local_70;
  string local_50;
  
  client = *(Client **)this;
  Vault::operator+(&local_50,"users/",path);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_50);
  puVar3 = (ulong *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar3) {
    local_a0._M_allocated_capacity = *puVar3;
    local_a0._8_8_ = plVar2[3];
    local_90.value_._M_dataplus._M_p = (pointer)&local_a0;
  }
  else {
    local_a0._M_allocated_capacity = *puVar3;
    local_90.value_._M_dataplus._M_p = (pointer)*plVar2;
  }
  local_90.value_._M_string_length = plVar2[1];
  *plVar2 = (long)puVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  paVar1 = &local_90.value_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.value_._M_dataplus._M_p == &local_a0) {
    local_90.value_.field_2._8_8_ = local_a0._8_8_;
    local_90.value_._M_dataplus._M_p = (pointer)paVar1;
  }
  local_90.value_.field_2._M_allocated_capacity = local_a0._M_allocated_capacity;
  local_a0._M_allocated_capacity = local_a0._M_allocated_capacity & 0xffffffffffffff00;
  getUrl(&local_70,this,&local_90);
  HttpConsumer::post(__return_storage_ptr__,client,&local_70,parameters);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.value_._M_dataplus._M_p != &local_70.value_.field_2) {
    operator_delete(local_70.value_._M_dataplus._M_p,
                    local_70.value_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.value_._M_dataplus._M_p != paVar1) {
    operator_delete(local_90.value_._M_dataplus._M_p,
                    local_90.value_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::string>
Vault::UserPass::updatePassword(const Path &path,
                                const Parameters &parameters) {
  return HttpConsumer::post(
      client_, getUrl(Path{"users/" + path + "/password"}), parameters);
}